

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqcompiler.cpp
# Opt level: O0

void __thiscall SQCompiler::LogicalAndExp(SQCompiler *this)

{
  SQFuncState *this_00;
  SQInteger SVar1;
  SQInteger arg0;
  SQInteger pos;
  SQInteger second_exp;
  SQInteger jpos;
  SQInteger trg;
  SQInteger first_exp;
  SQCompiler *this_local;
  
  BitwiseOrExp(this);
  while (this->_token == 0x10e) {
    SVar1 = SQFuncState::PopTarget(this->_fs);
    arg0 = SQFuncState::PushTarget(this->_fs,-1);
    SQFuncState::AddInstruction(this->_fs,_OP_AND,arg0,0,SVar1,0);
    pos = SQFuncState::GetCurrentPos(this->_fs);
    if (arg0 != SVar1) {
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,arg0,SVar1,0,0);
    }
    Lex(this);
    INVOKE_EXP<void(SQCompiler::*)()>(this,0x1b0500);
    SQFuncState::SnoozeOpt(this->_fs);
    SVar1 = SQFuncState::PopTarget(this->_fs);
    if (arg0 != SVar1) {
      SQFuncState::AddInstruction(this->_fs,_OP_MOVE,arg0,SVar1,0,0);
    }
    SQFuncState::SnoozeOpt(this->_fs);
    this_00 = this->_fs;
    SVar1 = SQFuncState::GetCurrentPos(this->_fs);
    SQFuncState::SetIntructionParam(this_00,pos,1,SVar1 - pos);
    (this->_es).etype = 1;
  }
  return;
}

Assistant:

void LogicalAndExp()
    {
        BitwiseOrExp();
        for(;;) switch(_token) {
        case TK_AND: {
            SQInteger first_exp = _fs->PopTarget();
            SQInteger trg = _fs->PushTarget();
            _fs->AddInstruction(_OP_AND, trg, 0, first_exp, 0);
            SQInteger jpos = _fs->GetCurrentPos();
            if(trg != first_exp) _fs->AddInstruction(_OP_MOVE, trg, first_exp);
            Lex(); INVOKE_EXP(&SQCompiler::LogicalAndExp);
            _fs->SnoozeOpt();
            SQInteger second_exp = _fs->PopTarget();
            if(trg != second_exp) _fs->AddInstruction(_OP_MOVE, trg, second_exp);
            _fs->SnoozeOpt();
            _fs->SetIntructionParam(jpos, 1, (_fs->GetCurrentPos() - jpos));
            _es.etype = EXPR;
            break;
            }

        default:
            return;
        }
    }